

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::handle_file_request(Server *this,Request *req,Response *res,bool head)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  char *pcVar4;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  reference ppVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *kv;
  const_iterator __end5;
  const_iterator __begin5;
  Headers *__range5;
  char *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string sub_path;
  MountPointEntry *entry;
  iterator __end1;
  iterator __begin1;
  vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
  *__range1;
  bool head_local;
  Response *res_local;
  Request *req_local;
  Server *this_local;
  
  __end1 = std::
           vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
           ::begin(&this->base_dirs_);
  entry = (MountPointEntry *)
          std::
          vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
          ::end(&this->base_dirs_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<httplib::Server::MountPointEntry_*,_std::vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>_>
                                     *)&entry), bVar1) {
    sub_path.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<httplib::Server::MountPointEntry_*,_std::vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>_>
         ::operator*(&__end1);
    psVar3 = (string *)std::__cxx11::string::size();
    iVar2 = std::__cxx11::string::compare((ulong)&req->path,0,psVar3);
    if (iVar2 == 0) {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)&local_90,(ulong)&req->path);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "/",&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      bVar1 = detail::is_valid_path((string *)local_70);
      if (bVar1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (sub_path.field_2._8_8_ + 0x20),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                      );
        pcVar4 = (char *)std::__cxx11::string::back();
        if (*pcVar4 == '/') {
          std::__cxx11::string::operator+=((string *)&type,"index.html");
        }
        bVar1 = detail::is_file((string *)&type);
        if (bVar1) {
          detail::read_file((string *)&type,&res->body);
          pcVar4 = detail::find_content_type
                             ((string *)&type,&this->file_extension_and_mimetype_map_);
          if (pcVar4 != (char *)0x0) {
            Response::set_header(res,"Content-Type",pcVar4);
          }
          this_00 = (multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(sub_path.field_2._8_8_ + 0x40);
          __end5 = std::
                   multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::begin(this_00);
          kv = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::
                  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::end(this_00);
          while (bVar1 = std::operator!=(&__end5,(_Self *)&kv), bVar1) {
            ppVar5 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator*(&__end5);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            Response::set_header(res,pcVar4,&ppVar5->second);
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator++(&__end5);
          }
          bVar1 = Request::has_header(req,"Range");
          iVar2 = 200;
          if (bVar1) {
            iVar2 = 0xce;
          }
          res->status = iVar2;
          if ((!head) &&
             (bVar1 = std::function::operator_cast_to_bool((function *)&this->file_request_handler_)
             , bVar1)) {
            std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
                      (&this->file_request_handler_,req,res);
          }
          this_local._7_1_ = 1;
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
        std::__cxx11::string::~string((string *)&type);
        if (!bVar1) goto LAB_00145593;
      }
      else {
LAB_00145593:
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)local_70);
      if (bVar1) goto LAB_001455d5;
    }
    __gnu_cxx::
    __normal_iterator<httplib::Server::MountPointEntry_*,_std::vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>_>
    ::operator++(&__end1);
  }
  this_local._7_1_ = 0;
LAB_001455d5:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool Server::handle_file_request(const Request &req, Response &res,
											bool head) {
		for (const auto &entry : base_dirs_) {
			// Prefix match
			if (!req.path.compare(0, entry.mount_point.size(), entry.mount_point)) {
				std::string sub_path = "/" + req.path.substr(entry.mount_point.size());
				if (detail::is_valid_path(sub_path)) {
					auto path = entry.base_dir + sub_path;
					if (path.back() == '/') { path += "index.html"; }

					if (detail::is_file(path)) {
						detail::read_file(path, res.body);
						auto type =
								detail::find_content_type(path, file_extension_and_mimetype_map_);
						if (type) { res.set_header("Content-Type", type); }
						for (const auto &kv : entry.headers) {
							res.set_header(kv.first.c_str(), kv.second);
						}
						res.status = req.has_header("Range") ? 206 : 200;
						if (!head && file_request_handler_) {
							file_request_handler_(req, res);
						}
						return true;
					}
				}
			}
		}
		return false;
	}